

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void SetDimensionsFromMonitor(GLFWmonitor *monitor)

{
  GLFWvidmode *pGVar1;
  
  pGVar1 = glfwGetVideoMode(monitor);
  CORE.Window.display.width = pGVar1->width;
  CORE.Window.display.height = pGVar1->height;
  if (CORE.Window.screen.width == 0) {
    CORE.Window.screen.width = pGVar1->width;
  }
  if (CORE.Window.screen.height == 0) {
    CORE.Window.screen.height = pGVar1->height;
  }
  return;
}

Assistant:

static void SetDimensionsFromMonitor(GLFWmonitor *monitor)
{
  const GLFWvidmode *mode = glfwGetVideoMode(monitor);

  // Default display resolution to that of the current mode
  CORE.Window.display.width = mode->width;
  CORE.Window.display.height = mode->height;

  // Set screen width/height to the display width/height if they are 0
  if (CORE.Window.screen.width == 0) CORE.Window.screen.width = CORE.Window.display.width;
  if (CORE.Window.screen.height == 0) CORE.Window.screen.height = CORE.Window.display.height;
}